

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<float>::Swap(RepeatedField<float> *this,RepeatedField<float> *other)

{
  Arena *pAVar1;
  Arena *pAVar2;
  undefined1 local_28 [8];
  RepeatedField<float> temp;
  RepeatedField<float> *other_local;
  RepeatedField<float> *this_local;
  
  if (this != other) {
    temp.rep_ = (Rep *)other;
    pAVar1 = GetArenaNoVirtual(this);
    pAVar2 = GetArenaNoVirtual((RepeatedField<float> *)temp.rep_);
    if (pAVar1 == pAVar2) {
      InternalSwap(this,(RepeatedField<float> *)temp.rep_);
    }
    else {
      pAVar1 = GetArenaNoVirtual((RepeatedField<float> *)temp.rep_);
      RepeatedField((RepeatedField<float> *)local_28,pAVar1);
      MergeFrom((RepeatedField<float> *)local_28,this);
      CopyFrom(this,(RepeatedField<float> *)temp.rep_);
      UnsafeArenaSwap((RepeatedField<float> *)temp.rep_,(RepeatedField<float> *)local_28);
      ~RepeatedField((RepeatedField<float> *)local_28);
    }
  }
  return;
}

Assistant:

void RepeatedField<Element>::Swap(RepeatedField* other) {
  if (this == other) return;
  if (GetArenaNoVirtual() == other->GetArenaNoVirtual()) {
    InternalSwap(other);
  } else {
    RepeatedField<Element> temp(other->GetArenaNoVirtual());
    temp.MergeFrom(*this);
    CopyFrom(*other);
    other->UnsafeArenaSwap(&temp);
  }
}